

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

int cmOutputConverter::Shell__CharNeedsQuotes(char c,int flags)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((flags & 0x104U) != 4) {
    iVar2 = 1;
    if ((c != '\t') && (c != ' ')) {
      if (((uint)flags >> 8 & 1) == 0) {
        iVar1 = Shell__CharNeedsQuotesOnWindows(c);
      }
      else {
        iVar1 = Shell__CharNeedsQuotesOnUnix(c);
      }
      if (iVar1 == 0) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int cmOutputConverter::Shell__CharNeedsQuotes(char c, int flags)
{
  /* On Windows the built-in command shell echo never needs quotes.  */
  if (!(flags & Shell_Flag_IsUnix) && (flags & Shell_Flag_EchoWindows)) {
    return 0;
  }

  /* On all platforms quotes are needed to preserve whitespace.  */
  if (Shell__CharIsWhitespace(c)) {
    return 1;
  }

  if (flags & Shell_Flag_IsUnix) {
    /* On UNIX several special characters need quotes to preserve them.  */
    if (Shell__CharNeedsQuotesOnUnix(c)) {
      return 1;
    }
  } else {
    /* On Windows several special characters need quotes to preserve them.  */
    if (Shell__CharNeedsQuotesOnWindows(c)) {
      return 1;
    }
  }
  return 0;
}